

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go.h
# Opt level: O3

uint __thiscall GoState<3U,_3U>::compute_hash_value(GoState<3U,_3U> *this)

{
  uint uVar1;
  int i;
  long lVar2;
  int j;
  long lVar3;
  uchar (*pauVar4) [3];
  
  pauVar4 = this->board;
  lVar2 = 0;
  uVar1 = 0;
  do {
    lVar3 = 0;
    do {
      uVar1 = (uint)(*pauVar4)[lVar3] + uVar1 * 0x10001;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    lVar2 = lVar2 + 1;
    pauVar4 = pauVar4 + 1;
  } while (lVar2 != 3);
  return uVar1;
}

Assistant:

virtual unsigned int compute_hash_value() const
	{
		unsigned int value = 0;
		for (int i = 0; i < M; ++i) {
		for (int j = 0; j < N; ++j) {
			value = 65537 * value + board[i][j];
		}}
		return value;
	}